

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void zsummer::log4z::ParseConfig
               (char *file,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
               *outInfo)

{
  CLog4zFile this;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  reference pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  ostream *poVar8;
  char *__nptr;
  pointer ppVar9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_LoggerInfo>_>::value,_pair<iterator,_bool>_>
  _Var10;
  _Self local_4a0;
  _Self local_498;
  iterator iter;
  string local_470 [32];
  long local_450;
  size_t pos;
  undefined1 local_440;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
  local_438;
  undefined1 local_390 [8];
  LoggerInfo li;
  _Self local_300;
  iterator iter_1;
  undefined1 local_2d8 [8];
  string tmpstr;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  undefined1 local_2a8 [8];
  string value;
  string key;
  string line;
  char buf [500];
  int curLineNum;
  string curLoggerName;
  CLog4zFile local_20;
  CLog4zFile f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
  *outInfo_local;
  char *file_local;
  
  f.m_file = (FILE *)outInfo;
  CLog4zFile::CLog4zFile(&local_20);
  CLog4zFile::Open(&local_20,file,"r");
  bVar1 = CLog4zFile::IsOpen(&local_20);
  if (bVar1) {
    std::__cxx11::string::string((string *)(buf + 0x1f0));
    buf[0x1ec] = '\0';
    buf[0x1ed] = '\0';
    buf[0x1ee] = '\0';
    buf[0x1ef] = '\0';
    std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_2a8);
    while( true ) {
      memset(line.field_2._M_local_buf + 8,0,500);
      bVar1 = CLog4zFile::ReadLine(&local_20,line.field_2._M_local_buf + 8,499);
      if (!bVar1) break;
      std::__cxx11::string::operator=
                ((string *)(key.field_2._M_local_buf + 8),line.field_2._M_local_buf + 8);
      buf._492_4_ = buf._492_4_ + 1;
      TrimLogConfig((string *)((long)&key.field_2 + 8),'\0');
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_2b0._M_current = (char *)std::__cxx11::string::begin();
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_2b0);
        if (*pcVar4 != '#') {
          tmpstr.field_2._8_8_ = std::__cxx11::string::begin();
          pcVar4 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&tmpstr.field_2 + 8));
          if (*pcVar4 == '[') {
            TrimLogConfig((string *)((long)&key.field_2 + 8),'[');
            TrimLogConfig((string *)((long)&key.field_2 + 8),']');
            std::__cxx11::string::operator=
                      ((string *)(buf + 0x1f0),(string *)(key.field_2._M_local_buf + 8));
            std::__cxx11::string::string
                      ((string *)local_2d8,(string *)(key.field_2._M_local_buf + 8));
            _Var5._M_current = (char *)std::__cxx11::string::begin();
            _Var6._M_current = (char *)std::__cxx11::string::end();
            _Var7._M_current = (char *)std::__cxx11::string::begin();
            iter_1._M_node =
                 (_Base_ptr)
                 std::
                 transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                           (_Var5,_Var6,_Var7,tolower);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2d8,"main");
            if (bVar1) {
              std::__cxx11::string::operator=((string *)(buf + 0x1f0),"Main");
            }
            std::__cxx11::string::~string((string *)local_2d8);
            local_300._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                         *)f.m_file,(key_type *)(buf + 0x1f0));
            li._handle.m_file =
                 (FILE *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                         ::end(f.m_file);
            bVar1 = std::operator==(&local_300,(_Self *)&li._handle);
            if (bVar1) {
              LoggerInfo::LoggerInfo((LoggerInfo *)local_390);
              LoggerInfo::SetDefaultInfo((LoggerInfo *)local_390);
              std::__cxx11::string::operator=((string *)local_390,(string *)(buf + 0x1f0));
              this = f;
              std::make_pair<std::__cxx11::string&,zsummer::log4z::LoggerInfo&>
                        (&local_438,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390,(LoggerInfo *)local_390);
              _Var10 = std::
                       map<std::__cxx11::string,zsummer::log4z::LoggerInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
                       ::insert<std::pair<std::__cxx11::string,zsummer::log4z::LoggerInfo>>
                                 ((map<std::__cxx11::string,zsummer::log4z::LoggerInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
                                   *)this.m_file,&local_438);
              pos = (size_t)_Var10.first._M_node;
              local_440 = _Var10.second;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
              ::~pair(&local_438);
              LoggerInfo::~LoggerInfo((LoggerInfo *)local_390);
            }
            else {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "log4z configure warning: dumplicate logger name:[");
              poVar8 = std::operator<<(poVar8,(string *)(buf + 0x1f0));
              poVar8 = std::operator<<(poVar8,"] at line:");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,buf._492_4_);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            local_450 = std::__cxx11::string::find_first_of((char)&key + '\x18',0x3d);
            if (local_450 == -1) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "log4z configure warning: unresolved line:[");
              poVar8 = std::operator<<(poVar8,(string *)(key.field_2._M_local_buf + 8));
              poVar8 = std::operator<<(poVar8,"] at line:");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,buf._492_4_);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            }
            else {
              std::__cxx11::string::substr((ulong)local_470,(ulong)((long)&key.field_2 + 8));
              std::__cxx11::string::operator=((string *)(value.field_2._M_local_buf + 8),local_470);
              std::__cxx11::string::~string(local_470);
              std::__cxx11::string::substr((ulong)&iter,(ulong)((long)&key.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_2a8,(string *)&iter);
              std::__cxx11::string::~string((string *)&iter);
              TrimLogConfig((string *)((long)&value.field_2 + 8),'\0');
              TrimLogConfig((string *)local_2a8,'\0');
              local_498._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                           *)f.m_file,(key_type *)(buf + 0x1f0));
              local_4a0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                          *)f.m_file);
              bVar1 = std::operator==(&local_498,&local_4a0);
              if (bVar1) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "log4z configure warning: not found current logger name:[")
                ;
                poVar8 = std::operator<<(poVar8,(string *)(buf + 0x1f0));
                poVar8 = std::operator<<(poVar8,"] at line:");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,buf._492_4_);
                poVar8 = std::operator<<(poVar8,", key=");
                poVar8 = std::operator<<(poVar8,(string *)(value.field_2._M_local_buf + 8));
                poVar8 = std::operator<<(poVar8,", value=");
                poVar8 = std::operator<<(poVar8,(string *)local_2a8);
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              }
              else {
                _Var5._M_current = (char *)std::__cxx11::string::begin();
                _Var6._M_current = (char *)std::__cxx11::string::end();
                _Var7._M_current = (char *)std::__cxx11::string::begin();
                std::
                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                          (_Var5,_Var6,_Var7,tolower);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&value.field_2 + 8),"path");
                if (bVar1) {
                  ppVar9 = std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                           ::operator->(&local_498);
                  std::__cxx11::string::operator=
                            ((string *)&(ppVar9->second)._path,(string *)local_2a8);
                }
                else {
                  _Var5._M_current = (char *)std::__cxx11::string::begin();
                  _Var6._M_current = (char *)std::__cxx11::string::end();
                  _Var7._M_current = (char *)std::__cxx11::string::begin();
                  std::
                  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                            (_Var5,_Var6,_Var7,tolower);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&value.field_2 + 8),"level");
                  if (bVar1) {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_2a8,"debug");
                    if ((bVar1) ||
                       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_2a8,"all"), bVar1)) {
                      ppVar9 = std::
                               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                               ::operator->(&local_498);
                      (ppVar9->second)._level = 0;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_2a8,"info");
                      if (bVar1) {
                        ppVar9 = std::
                                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                 ::operator->(&local_498);
                        (ppVar9->second)._level = 1;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_2a8,"warn");
                        if ((bVar1) ||
                           (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2a8,"warning"), bVar1)) {
                          ppVar9 = std::
                                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                   ::operator->(&local_498);
                          (ppVar9->second)._level = 2;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2a8,"error");
                          if (bVar1) {
                            ppVar9 = std::
                                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                     ::operator->(&local_498);
                            (ppVar9->second)._level = 3;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2a8,"alarm");
                            if (bVar1) {
                              ppVar9 = std::
                                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                       ::operator->(&local_498);
                              (ppVar9->second)._level = 2;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2a8,"fatal");
                              if (bVar1) {
                                ppVar9 = std::
                                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                         ::operator->(&local_498);
                                (ppVar9->second)._level = 5;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&value.field_2 + 8),"display");
                    if (bVar1) {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_2a8,"false");
                      if ((bVar1) ||
                         (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2a8,"0"), bVar1)) {
                        ppVar9 = std::
                                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                 ::operator->(&local_498);
                        (ppVar9->second)._display = false;
                      }
                      else {
                        ppVar9 = std::
                                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                 ::operator->(&local_498);
                        (ppVar9->second)._display = true;
                      }
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&value.field_2 + 8),"monthdir");
                      if (bVar1) {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_2a8,"false");
                        if ((bVar1) ||
                           (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2a8,"0"), bVar1)) {
                          ppVar9 = std::
                                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                   ::operator->(&local_498);
                          (ppVar9->second)._monthdir = false;
                        }
                        else {
                          ppVar9 = std::
                                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                   ::operator->(&local_498);
                          (ppVar9->second)._monthdir = true;
                        }
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)&value.field_2 + 8),"limitsize");
                        if (bVar1) {
                          __nptr = (char *)std::__cxx11::string::c_str();
                          uVar2 = atoi(__nptr);
                          ppVar9 = std::
                                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>
                                   ::operator->(&local_498);
                          (ppVar9->second)._limitsize = uVar2;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(buf + 0x1f0));
  }
  CLog4zFile::~CLog4zFile(&local_20);
  return;
}

Assistant:

static void ParseConfig(const char* file, std::map<std::string, LoggerInfo> & outInfo)
{
	//! read file content
	{
		CLog4zFile f;
		f.Open(file, "r");

		if (f.IsOpen())
		{
			std::string curLoggerName;
			int curLineNum = 0;
			char buf[500];
			std::string line;
			std::string key;
			std::string value;
			do
			{
				memset(buf, 0, 500);
				if (!f.ReadLine(buf, 500-1))
				{
					break;
				}
				line = buf;
				curLineNum++;
				TrimLogConfig(line);

				if (line.empty())
				{
					continue;
				}
				if (*(line.begin()) == '#')
				{
					continue;
				}
				if (*(line.begin()) == '[')
				{
					TrimLogConfig(line, '[');
					TrimLogConfig(line, ']');
					curLoggerName = line;
					{
						std::string tmpstr = line;
						std::transform(tmpstr.begin(), tmpstr.end(), tmpstr.begin(), ::tolower);
						if (tmpstr == "main")
						{
							curLoggerName = "Main";
						}
					}
					std::map<std::string, LoggerInfo>::iterator iter = outInfo.find(curLoggerName);
					if (iter == outInfo.end())
					{
						LoggerInfo li;
						li.SetDefaultInfo();
						li._name = curLoggerName;
						outInfo.insert(std::make_pair(li._name, li));
					}
					else
					{
						std::cout << "log4z configure warning: dumplicate logger name:["<< curLoggerName << "] at line:" << curLineNum << std::endl;
					}
					continue;
				}
				size_t pos = line.find_first_of('=');
				if (pos == std::string::npos)
				{
					std::cout << "log4z configure warning: unresolved line:["<< line << "] at line:" << curLineNum << std::endl;
					continue;
				}
				key = line.substr(0, pos);
				value = line.substr(pos+1);
				TrimLogConfig(key);
				TrimLogConfig(value);
				std::map<std::string, LoggerInfo>::iterator iter = outInfo.find(curLoggerName);
				if (iter == outInfo.end())
				{
					std::cout << "log4z configure warning: not found current logger name:["<< curLoggerName << "] at line:" << curLineNum
						<< ", key=" <<key << ", value=" << value << std::endl;
					continue;
				}
				std::transform(key.begin(), key.end(), key.begin(), ::tolower);
				//! path
				if (key == "path")
				{
					iter->second._path = value;
					continue;
				}
				std::transform(value.begin(), value.end(), value.begin(), ::tolower);
				//! level
				if (key == "level")
				{
					if (value == "debug" || value == "all")
					{
						iter->second._level = LOG_LEVEL_DEBUG;
					}
					else if (value == "info")
					{
						iter->second._level = LOG_LEVEL_INFO;
					}
					else if (value == "warn" || value == "warning")
					{
						iter->second._level = LOG_LEVEL_WARN;
					}
					else if (value == "error")
					{
						iter->second._level = LOG_LEVEL_ERROR;
					}
					else if (value == "alarm")
					{
						iter->second._level = LOG_LEVEL_WARN;
					}
					else if (value == "fatal")
					{
						iter->second._level = LOG_LEVEL_FATAL;
					}
				}
				//! display
				else if (key == "display")
				{
					if (value == "false" || value == "0")
					{
						iter->second._display = false;
					}
					else
					{
						iter->second._display = true;
					}
				}
				//! monthdir
				else if (key == "monthdir")
				{
					if (value == "false" || value == "0")
					{
						iter->second._monthdir = false;
					}
					else
					{
						iter->second._monthdir = true;
					}
				}
				//! limit file size
				else if (key == "limitsize")
				{
					iter->second._limitsize = atoi(value.c_str());
				}

			} while (1);
		}
	}
}